

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_outlines_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::testOutlines(FuzzHelper *this)

{
  QPDFOutlineObjectHelper *pQVar1;
  _List_node_base *p_Var2;
  QPDFOutlineObjectHelper *ol;
  QPDFOutlineObjectHelper *this_00;
  list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  queue;
  shared_ptr<QPDF> q;
  QPDFOutlineDocumentHelper odh;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_98;
  _List_base<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  local_80;
  undefined1 local_68 [64];
  
  getQpdf((FuzzHelper *)local_68);
  local_80._M_impl._M_node._M_size = 0;
  local_80._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_80;
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)(local_68 + 0x20),(QPDF *)local_68._0_8_);
  QPDFOutlineDocumentHelper::getTopLevelOutlines
            (&local_98,(QPDFOutlineDocumentHelper *)(local_68 + 0x20));
  p_Var2 = (_List_node_base *)operator_new(0x28);
  p_Var2[1]._M_next =
       (_List_node_base *)
       local_98.
       super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl
       .super__Vector_impl_data._M_start;
  p_Var2[1]._M_prev =
       (_List_node_base *)
       local_98.
       super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl
       .super__Vector_impl_data._M_finish;
  p_Var2[2]._M_next =
       (_List_node_base *)
       local_98.
       super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
  std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector(&local_98)
  ;
  if (local_80._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_80) {
    do {
      pQVar1 = (QPDFOutlineObjectHelper *)
               local_80._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
      for (this_00 = (QPDFOutlineObjectHelper *)
                     local_80._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
          this_00 != pQVar1; this_00 = this_00 + 1) {
        QPDFOutlineObjectHelper::getDestPage((QPDFOutlineObjectHelper *)(local_68 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_);
        }
        QPDFOutlineObjectHelper::getKids(&local_98,this_00);
        p_Var2 = (_List_node_base *)operator_new(0x28);
        p_Var2[1]._M_next =
             (_List_node_base *)
             local_98.
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_start;
        p_Var2[1]._M_prev =
             (_List_node_base *)
             local_98.
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        p_Var2[2]._M_next =
             (_List_node_base *)
             local_98.
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_98.
        super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.
        super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.
        super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var2);
        local_80._M_impl._M_node._M_size = local_80._M_impl._M_node._M_size + 1;
        std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                  (&local_98);
      }
      std::__cxx11::
      list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
      ::_M_erase((list<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
                  *)&local_80,(iterator)local_80._M_impl._M_node.super__List_node_base._M_next);
    } while (local_80._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_80)
    ;
  }
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)(local_68 + 0x20));
  std::__cxx11::
  _List_base<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::allocator<std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>
  ::_M_clear(&local_80);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

void
FuzzHelper::testOutlines()
{
    std::shared_ptr<QPDF> q = getQpdf();
    std::list<std::vector<QPDFOutlineObjectHelper>> queue;
    QPDFOutlineDocumentHelper odh(*q);
    queue.push_back(odh.getTopLevelOutlines());
    while (!queue.empty()) {
        for (auto& ol: *(queue.begin())) {
            ol.getDestPage();
            queue.push_back(ol.getKids());
        }
        queue.pop_front();
    }
}